

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeBlocksGenerator::GetCBCompilerId_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmMakefile *mf)

{
  cmGlobalGenerator *pcVar1;
  bool bVar2;
  bool bVar3;
  string *psVar4;
  string compilerIdVar;
  string userCompiler;
  allocator<char> local_89;
  string local_88;
  string local_68;
  char *local_48;
  size_type local_40;
  char local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_CODEBLOCKS_COMPILER_ID",(allocator<char> *)&local_88);
  psVar4 = cmMakefile::GetSafeDefinition(mf,&local_68);
  std::__cxx11::string::string((string *)&local_48,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_68);
  if (local_40 != 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_48 == &local_38) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_37,local_38);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_30;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_48;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_37,local_38);
    }
    __return_storage_ptr__->_M_string_length = local_40;
    local_40 = 0;
    local_38 = '\0';
    local_48 = &local_38;
    goto LAB_00438f8c;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"CXX",&local_89);
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (bVar2) {
LAB_00438dac:
    std::__cxx11::string::assign((char *)&local_68);
LAB_00438db6:
    bVar2 = false;
  }
  else {
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"C",&local_89);
    bVar2 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (bVar2) goto LAB_00438dac;
    pcVar1 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Fortran",&local_89);
    bVar2 = cmGlobalGenerator::GetLanguageEnabled(pcVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (!bVar2) goto LAB_00438db6;
    bVar2 = true;
    std::__cxx11::string::assign((char *)&local_68);
  }
  psVar4 = cmMakefile::GetSafeDefinition(mf,&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"gcc",(allocator<char> *)&local_88);
  bVar3 = std::operator==(psVar4,"MSVC");
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"MSVC10",&local_89);
    cmMakefile::IsDefinitionSet(mf,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
LAB_00438f77:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else {
    bVar3 = std::operator==(psVar4,"Borland");
    if ((bVar3) || (bVar3 = std::operator==(psVar4,"SDCC"), bVar3)) goto LAB_00438f77;
    bVar3 = std::operator==(psVar4,"Intel");
    if (bVar3) {
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"WIN32",&local_89);
        cmMakefile::IsDefinitionSet(mf,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
      }
      goto LAB_00438f77;
    }
    bVar2 = std::operator==(psVar4,"Watcom");
    if ((((bVar2) || (bVar2 = std::operator==(psVar4,"OpenWatcom"), bVar2)) ||
        (bVar2 = std::operator==(psVar4,"Clang"), bVar2)) ||
       (((bVar2 = std::operator==(psVar4,"PGI"), bVar2 ||
         (bVar2 = std::operator==(psVar4,"LCC"), bVar2)) ||
        (bVar2 = std::operator==(psVar4,"GNU"), bVar2)))) goto LAB_00438f77;
  }
  std::__cxx11::string::~string((string *)&local_68);
LAB_00438f8c:
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::GetCBCompilerId(const cmMakefile* mf)
{
  // allow the user to overwrite the detected compiler
  std::string userCompiler =
    mf->GetSafeDefinition("CMAKE_CODEBLOCKS_COMPILER_ID");
  if (!userCompiler.empty()) {
    return userCompiler;
  }

  // figure out which language to use
  // for now care only for C, C++, and Fortran

  // projects with C/C++ and Fortran are handled as C/C++ projects
  bool pureFortran = false;
  std::string compilerIdVar;
  if (this->GlobalGenerator->GetLanguageEnabled("CXX")) {
    compilerIdVar = "CMAKE_CXX_COMPILER_ID";
  } else if (this->GlobalGenerator->GetLanguageEnabled("C")) {
    compilerIdVar = "CMAKE_C_COMPILER_ID";
  } else if (this->GlobalGenerator->GetLanguageEnabled("Fortran")) {
    compilerIdVar = "CMAKE_Fortran_COMPILER_ID";
    pureFortran = true;
  }

  std::string const& compilerId = mf->GetSafeDefinition(compilerIdVar);
  std::string compiler = "gcc"; // default to gcc
  if (compilerId == "MSVC") {
    if (mf->IsDefinitionSet("MSVC10")) {
      compiler = "msvc10";
    } else {
      compiler = "msvc8";
    }
  } else if (compilerId == "Borland") {
    compiler = "bcc";
  } else if (compilerId == "SDCC") {
    compiler = "sdcc";
  } else if (compilerId == "Intel") {
    if (pureFortran && mf->IsDefinitionSet("WIN32")) {
      compiler = "ifcwin"; // Intel Fortran for Windows (known by cbFortran)
    } else {
      compiler = "icc";
    }
  } else if (compilerId == "Watcom" || compilerId == "OpenWatcom") {
    compiler = "ow";
  } else if (compilerId == "Clang") {
    compiler = "clang";
  } else if (compilerId == "PGI") {
    if (pureFortran) {
      compiler = "pgifortran";
    } else {
      compiler = "pgi"; // does not exist as default in CodeBlocks 16.01
    }
  } else if (compilerId == "LCC") {
    if (pureFortran) {
      compiler = "lfortran";
    } else {
      compiler = "lcc";
    }
  } else if (compilerId == "GNU") {
    if (pureFortran) {
      compiler = "gfortran";
    } else {
      compiler = "gcc";
    }
  }
  return compiler;
}